

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_env.c
# Opt level: O0

_Bool gravity_env_get(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value_00;
  gravity_fiber_t *fiber;
  char *__s;
  size_t sVar1;
  gravity_value_t gVar2;
  gravity_class_t *local_1068;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_1060;
  gravity_class_t *local_1058;
  gravity_value_t rt;
  char *value;
  char *key;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (args[1].isa == gravity_class_string) {
    __s = getenv((char *)(args[1].field_1.p)->objclass);
    local_1058 = gravity_class_null;
    rt.isa = (gravity_class_t *)0x1;
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      gVar2 = gravity_string_to_value(vm,__s,(uint32_t)sVar1);
      local_1068 = gVar2.isa;
      local_1058 = local_1068;
      local_1060 = gVar2.field_1;
      rt.isa = local_1060.p;
    }
    gVar2.field_1.p = rt.isa;
    gVar2.isa = local_1058;
    gravity_vm_setslot(vm,gVar2,_buffer._4088_4_);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_1028,0x1000,"Environment variable key must be a string.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool gravity_env_get(gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(nargs)
    
    if(!VALUE_ISA_STRING(args[1])) {
        RETURN_ERROR("Environment variable key must be a string.");
    }

    char *key = VALUE_AS_CSTRING(args[1]);
    char *value = getenv(key);
    gravity_value_t rt = VALUE_FROM_UNDEFINED;

    // GRAVITY_DEBUG_PRINT("[ENV::GET args : %i] %s => %s\n", nargs, key, value);

    if (value) {
        rt = VALUE_FROM_STRING(vm, value, (uint32_t)strlen(value));
    }

    RETURN_VALUE(rt, rindex);
}